

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O1

void caffe::protobuf_caffe_2eproto::TableStruct::Shutdown(void)

{
  if (DAT_00744110 == '\x01') {
    DAT_00744110 = '\0';
    (*(code *)*_BlobShape_default_instance_)();
  }
  if (DAT_00745528 != (long *)0x0) {
    (**(code **)(*DAT_00745528 + 8))();
  }
  if (DAT_007441a8 == '\x01') {
    DAT_007441a8 = '\0';
    (*(code *)*_BlobProto_default_instance_)();
  }
  if (_DAT_00745538 != (long *)0x0) {
    (**(code **)(*_DAT_00745538 + 8))();
  }
  if (DAT_007441e0 == '\x01') {
    DAT_007441e0 = '\0';
    (*(code *)*_BlobProtoVector_default_instance_)();
  }
  if (_DAT_00745548 != (long *)0x0) {
    (**(code **)(*_DAT_00745548 + 8))();
  }
  if (DAT_00744230 == '\x01') {
    DAT_00744230 = '\0';
    (*(code *)*_Datum_default_instance_)();
  }
  if (_DAT_00745558 != (long *)0x0) {
    (**(code **)(*_DAT_00745558 + 8))();
  }
  if (DAT_00744278 == '\x01') {
    DAT_00744278 = '\0';
    (*(code *)*_FillerParameter_default_instance_)();
  }
  if (_DAT_00745568 != (long *)0x0) {
    (**(code **)(*_DAT_00745568 + 8))();
  }
  if (DAT_00745910 == '\x01') {
    DAT_00745910 = '\0';
    if (FillerParameter::_default_type__abi_cxx11_ != &DAT_00745900) {
      operator_delete(FillerParameter::_default_type__abi_cxx11_,DAT_00745900 + 1);
    }
  }
  if (DAT_00744320 == '\x01') {
    DAT_00744320 = '\0';
    (*(code *)*_NetParameter_default_instance_)();
  }
  if (DAT_00745578 != (long *)0x0) {
    (**(code **)(*DAT_00745578 + 8))();
  }
  if (DAT_00744458 == '\x01') {
    DAT_00744458 = '\0';
    (*(code *)*_SolverParameter_default_instance_)();
  }
  if (_DAT_00745588 != (long *)0x0) {
    (**(code **)(*_DAT_00745588 + 8))();
  }
  if (DAT_00745938 == '\x01') {
    DAT_00745938 = '\0';
    if (SolverParameter::_default_regularization_type__abi_cxx11_ != &DAT_00745928) {
      operator_delete(SolverParameter::_default_regularization_type__abi_cxx11_,DAT_00745928 + 1);
    }
  }
  if (DAT_00745960 == '\x01') {
    DAT_00745960 = '\0';
    if (SolverParameter::_default_type__abi_cxx11_ != &DAT_00745950) {
      operator_delete(SolverParameter::_default_type__abi_cxx11_,DAT_00745950 + 1);
    }
  }
  if (DAT_007444a0 == '\x01') {
    DAT_007444a0 = '\0';
    (*(code *)*_SolverState_default_instance_)();
  }
  if (_DAT_00745598 != (long *)0x0) {
    (**(code **)(*_DAT_00745598 + 8))();
  }
  if (DAT_007444e0 == '\x01') {
    DAT_007444e0 = '\0';
    (*(code *)*_NetState_default_instance_)();
  }
  if (_DAT_007455a8 != (long *)0x0) {
    (**(code **)(*_DAT_007455a8 + 8))();
  }
  if (DAT_00744540 == '\x01') {
    DAT_00744540 = '\0';
    (*(code *)*_NetStateRule_default_instance_)();
  }
  if (_DAT_007455b8 != (long *)0x0) {
    (**(code **)(*_DAT_007455b8 + 8))();
  }
  if (DAT_00744578 == '\x01') {
    DAT_00744578 = '\0';
    (*(code *)*_ParamSpec_default_instance_)();
  }
  if (_DAT_007455c8 != (long *)0x0) {
    (**(code **)(*_DAT_007455c8 + 8))();
  }
  if (DAT_007447d8 == '\x01') {
    DAT_007447d8 = '\0';
    (*(code *)*_LayerParameter_default_instance_)();
  }
  if (_DAT_007455d8 != (long *)0x0) {
    (**(code **)(*_DAT_007455d8 + 8))();
  }
  if (DAT_00744820 == '\x01') {
    DAT_00744820 = '\0';
    (*(code *)*_TransformationParameter_default_instance_)();
  }
  if (_DAT_007455e8 != (long *)0x0) {
    (**(code **)(*_DAT_007455e8 + 8))();
  }
  if (DAT_00744850 == '\x01') {
    DAT_00744850 = '\0';
    (*(code *)*_LossParameter_default_instance_)();
  }
  if (_DAT_007455f8 != (long *)0x0) {
    (**(code **)(*_DAT_007455f8 + 8))();
  }
  if (DAT_00744880 == '\x01') {
    DAT_00744880 = '\0';
    (*(code *)*_AccuracyParameter_default_instance_)();
  }
  if (_DAT_00745608 != (long *)0x0) {
    (**(code **)(*_DAT_00745608 + 8))();
  }
  if (DAT_007448b0 == '\x01') {
    DAT_007448b0 = '\0';
    (*(code *)*_ArgMaxParameter_default_instance_)();
  }
  if (_DAT_00745618 != (long *)0x0) {
    (**(code **)(*_DAT_00745618 + 8))();
  }
  if (DAT_007448d8 == '\x01') {
    DAT_007448d8 = '\0';
    (*(code *)*_ConcatParameter_default_instance_)();
  }
  if (_DAT_00745628 != (long *)0x0) {
    (**(code **)(*_DAT_00745628 + 8))();
  }
  if (DAT_00744908 == '\x01') {
    DAT_00744908 = '\0';
    (*(code *)*_BatchNormParameter_default_instance_)();
  }
  if (_DAT_00745638 != (long *)0x0) {
    (**(code **)(*_DAT_00745638 + 8))();
  }
  if (DAT_00744938 == '\x01') {
    DAT_00744938 = '\0';
    (*(code *)*_BiasParameter_default_instance_)();
  }
  if (_DAT_00745648 != (long *)0x0) {
    (**(code **)(*_DAT_00745648 + 8))();
  }
  if (DAT_00744960 == '\x01') {
    DAT_00744960 = '\0';
    (*(code *)*_ContrastiveLossParameter_default_instance_)();
  }
  if (_DAT_00745658 != (long *)0x0) {
    (**(code **)(*_DAT_00745658 + 8))();
  }
  if (DAT_00744a00 == '\x01') {
    DAT_00744a00 = '\0';
    (*(code *)*_ConvolutionParameter_default_instance_)();
  }
  if (_DAT_00745668 != (long *)0x0) {
    (**(code **)(*_DAT_00745668 + 8))();
  }
  if (DAT_00744a38 == '\x01') {
    DAT_00744a38 = '\0';
    (*(code *)*_CropParameter_default_instance_)();
  }
  if (_DAT_00745678 != (long *)0x0) {
    (**(code **)(*_DAT_00745678 + 8))();
  }
  if (DAT_00744a88 == '\x01') {
    DAT_00744a88 = '\0';
    (*(code *)*_DataParameter_default_instance_)();
  }
  if (_DAT_00745688 != (long *)0x0) {
    (**(code **)(*_DAT_00745688 + 8))();
  }
  if (DAT_00744ab0 == '\x01') {
    DAT_00744ab0 = '\0';
    (*(code *)*_DropoutParameter_default_instance_)();
  }
  if (_DAT_00745698 != (long *)0x0) {
    (**(code **)(*_DAT_00745698 + 8))();
  }
  if (DAT_00744b40 == '\x01') {
    DAT_00744b40 = '\0';
    (*(code *)*_DummyDataParameter_default_instance_)();
  }
  if (DAT_007456a8 != (long *)0x0) {
    (**(code **)(*DAT_007456a8 + 8))();
  }
  if (DAT_00744b78 == '\x01') {
    DAT_00744b78 = '\0';
    (*(code *)*_EltwiseParameter_default_instance_)();
  }
  if (_DAT_007456b8 != (long *)0x0) {
    (**(code **)(*_DAT_007456b8 + 8))();
  }
  if (DAT_00744ba0 == '\x01') {
    DAT_00744ba0 = '\0';
    (*(code *)*_ELUParameter_default_instance_)();
  }
  if (DAT_007456c8 != (long *)0x0) {
    (**(code **)(*DAT_007456c8 + 8))();
  }
  if (DAT_00744be0 == '\x01') {
    DAT_00744be0 = '\0';
    (*(code *)*_EmbedParameter_default_instance_)();
  }
  if (_DAT_007456d8 != (long *)0x0) {
    (**(code **)(*_DAT_007456d8 + 8))();
  }
  if (DAT_00744c10 == '\x01') {
    DAT_00744c10 = '\0';
    (*(code *)*_ExpParameter_default_instance_)();
  }
  if (_DAT_007456e8 != (long *)0x0) {
    (**(code **)(*_DAT_007456e8 + 8))();
  }
  if (DAT_00744c38 == '\x01') {
    DAT_00744c38 = '\0';
    (*(code *)*_FlattenParameter_default_instance_)();
  }
  if (_DAT_007456f8 != (long *)0x0) {
    (**(code **)(*_DAT_007456f8 + 8))();
  }
  if (DAT_00744c68 == '\x01') {
    DAT_00744c68 = '\0';
    (*(code *)*_HDF5DataParameter_default_instance_)();
  }
  if (_DAT_00745708 != (long *)0x0) {
    (**(code **)(*_DAT_00745708 + 8))();
  }
  if (DAT_00744c90 == '\x01') {
    DAT_00744c90 = '\0';
    (*(code *)*_HDF5OutputParameter_default_instance_)();
  }
  if (_DAT_00745718 != (long *)0x0) {
    (**(code **)(*_DAT_00745718 + 8))();
  }
  if (DAT_00744cb8 == '\x01') {
    DAT_00744cb8 = '\0';
    (*(code *)*_HingeLossParameter_default_instance_)();
  }
  if (_DAT_00745728 != (long *)0x0) {
    (**(code **)(*_DAT_00745728 + 8))();
  }
  if (DAT_00744d10 == '\x01') {
    DAT_00744d10 = '\0';
    (*(code *)*_ImageDataParameter_default_instance_)();
  }
  if (_DAT_00745738 != (long *)0x0) {
    (**(code **)(*_DAT_00745738 + 8))();
  }
  if (DAT_00744d38 == '\x01') {
    DAT_00744d38 = '\0';
    (*(code *)*_InfogainLossParameter_default_instance_)();
  }
  if (_DAT_00745748 != (long *)0x0) {
    (**(code **)(*_DAT_00745748 + 8))();
  }
  if (DAT_00744d78 == '\x01') {
    DAT_00744d78 = '\0';
    (*(code *)*_InnerProductParameter_default_instance_)();
  }
  if (DAT_00745758 != (long *)0x0) {
    (**(code **)(*DAT_00745758 + 8))();
  }
  if (DAT_00744db0 == '\x01') {
    DAT_00744db0 = '\0';
    (*(code *)*_InputParameter_default_instance_)();
  }
  if (DAT_00745768 != (long *)0x0) {
    (**(code **)(*DAT_00745768 + 8))();
  }
  if (DAT_00744de0 == '\x01') {
    DAT_00744de0 = '\0';
    (*(code *)*_LogParameter_default_instance_)();
  }
  if (DAT_00745778 != (long *)0x0) {
    (**(code **)(*DAT_00745778 + 8))();
  }
  if (DAT_00744e18 == '\x01') {
    DAT_00744e18 = '\0';
    (*(code *)*_LRNParameter_default_instance_)();
  }
  if (DAT_00745788 != (long *)0x0) {
    (**(code **)(*DAT_00745788 + 8))();
  }
  if (DAT_00744e48 == '\x01') {
    DAT_00744e48 = '\0';
    (*(code *)*_MemoryDataParameter_default_instance_)();
  }
  if (DAT_00745798 != (long *)0x0) {
    (**(code **)(*DAT_00745798 + 8))();
  }
  if (DAT_00744e70 == '\x01') {
    DAT_00744e70 = '\0';
    (*(code *)*_MVNParameter_default_instance_)();
  }
  if (DAT_007457a8 != (long *)0x0) {
    (**(code **)(*DAT_007457a8 + 8))();
  }
  if (DAT_00744e98 == '\x01') {
    DAT_00744e98 = '\0';
    (*(code *)*_ParameterParameter_default_instance_)();
  }
  if (DAT_007457b8 != (long *)0x0) {
    (**(code **)(*DAT_007457b8 + 8))();
  }
  if (DAT_00744ee8 == '\x01') {
    DAT_00744ee8 = '\0';
    (*(code *)*_PoolingParameter_default_instance_)();
  }
  if (DAT_007457c8 != (long *)0x0) {
    (**(code **)(*DAT_007457c8 + 8))();
  }
  if (DAT_00744f18 == '\x01') {
    DAT_00744f18 = '\0';
    (*(code *)*_PowerParameter_default_instance_)();
  }
  if (DAT_007457d8 != (long *)0x0) {
    (**(code **)(*DAT_007457d8 + 8))();
  }
  if (DAT_00744f58 == '\x01') {
    DAT_00744f58 = '\0';
    (*(code *)*_PythonParameter_default_instance_)();
  }
  if (DAT_007457e8 != (long *)0x0) {
    (**(code **)(*DAT_007457e8 + 8))();
  }
  if (DAT_00744f90 == '\x01') {
    DAT_00744f90 = '\0';
    (*(code *)*_RecurrentParameter_default_instance_)();
  }
  if (_DAT_007457f8 != (long *)0x0) {
    (**(code **)(*_DAT_007457f8 + 8))();
  }
  if (DAT_00744fc0 == '\x01') {
    DAT_00744fc0 = '\0';
    (*(code *)*_ReductionParameter_default_instance_)();
  }
  if (_DAT_00745808 != (long *)0x0) {
    (**(code **)(*_DAT_00745808 + 8))();
  }
  if (DAT_00744fe8 == '\x01') {
    DAT_00744fe8 = '\0';
    (*(code *)*_ReLUParameter_default_instance_)();
  }
  if (_DAT_00745818 != (long *)0x0) {
    (**(code **)(*_DAT_00745818 + 8))();
  }
  if (DAT_00745018 == '\x01') {
    DAT_00745018 = '\0';
    (*(code *)*_ReshapeParameter_default_instance_)();
  }
  if (_DAT_00745828 != (long *)0x0) {
    (**(code **)(*_DAT_00745828 + 8))();
  }
  if (DAT_00745058 == '\x01') {
    DAT_00745058 = '\0';
    (*(code *)*_ScaleParameter_default_instance_)();
  }
  if (_DAT_00745838 != (long *)0x0) {
    (**(code **)(*_DAT_00745838 + 8))();
  }
  if (DAT_00745080 == '\x01') {
    DAT_00745080 = '\0';
    (*(code *)*_SigmoidParameter_default_instance_)();
  }
  if (_DAT_00745848 != (long *)0x0) {
    (**(code **)(*_DAT_00745848 + 8))();
  }
  if (DAT_007450b8 == '\x01') {
    DAT_007450b8 = '\0';
    (*(code *)*_SliceParameter_default_instance_)();
  }
  if (_DAT_00745858 != (long *)0x0) {
    (**(code **)(*_DAT_00745858 + 8))();
  }
  if (DAT_007450e0 == '\x01') {
    DAT_007450e0 = '\0';
    (*(code *)*_SoftmaxParameter_default_instance_)();
  }
  if (_DAT_00745868 != (long *)0x0) {
    (**(code **)(*_DAT_00745868 + 8))();
  }
  if (DAT_00745108 == '\x01') {
    DAT_00745108 = '\0';
    (*(code *)*_TanHParameter_default_instance_)();
  }
  if (_DAT_00745878 != (long *)0x0) {
    (**(code **)(*_DAT_00745878 + 8))();
  }
  if (DAT_00745130 == '\x01') {
    DAT_00745130 = '\0';
    (*(code *)*_TileParameter_default_instance_)();
  }
  if (_DAT_00745888 != (long *)0x0) {
    (**(code **)(*_DAT_00745888 + 8))();
  }
  if (DAT_00745158 == '\x01') {
    DAT_00745158 = '\0';
    (*(code *)*_ThresholdParameter_default_instance_)();
  }
  if (_DAT_00745898 != (long *)0x0) {
    (**(code **)(*_DAT_00745898 + 8))();
  }
  if (DAT_007451b8 == '\x01') {
    DAT_007451b8 = '\0';
    (*(code *)*_WindowDataParameter_default_instance_)();
  }
  if (_DAT_007458a8 != (long *)0x0) {
    (**(code **)(*_DAT_007458a8 + 8))();
  }
  if (DAT_00745988 == '\x01') {
    DAT_00745988 = '\0';
    if (WindowDataParameter::_default_crop_mode__abi_cxx11_ != &DAT_00745978) {
      operator_delete(WindowDataParameter::_default_crop_mode__abi_cxx11_,DAT_00745978 + 1);
    }
  }
  if (DAT_007451e8 == '\x01') {
    DAT_007451e8 = '\0';
    (*(code *)*_SPPParameter_default_instance_)();
  }
  if (_DAT_007458b8 != (long *)0x0) {
    (**(code **)(*_DAT_007458b8 + 8))();
  }
  if (DAT_007453e0 == '\x01') {
    DAT_007453e0 = '\0';
    (*(code *)*_V1LayerParameter_default_instance_)();
  }
  if (DAT_007458c8 != (long *)0x0) {
    (**(code **)(*DAT_007458c8 + 8))();
  }
  if (DAT_007454e8 == '\x01') {
    DAT_007454e8 = '\0';
    (*(code *)*_V0LayerParameter_default_instance_)();
  }
  if (DAT_007458d8 != (long *)0x0) {
    (**(code **)(*DAT_007458d8 + 8))();
  }
  if (DAT_007459b0 == '\x01') {
    DAT_007459b0 = '\0';
    if (V0LayerParameter::_default_det_crop_mode__abi_cxx11_ != &DAT_007459a0) {
      operator_delete(V0LayerParameter::_default_det_crop_mode__abi_cxx11_,DAT_007459a0 + 1);
    }
  }
  if (DAT_00745518 == '\x01') {
    DAT_00745518 = '\0';
    (*(code *)*_PReLUParameter_default_instance_)();
  }
  if (_DAT_007458e8 != (long *)0x0) {
    (**(code **)(*_DAT_007458e8 + 8))();
    return;
  }
  return;
}

Assistant:

void TableStruct::Shutdown() {
  _BlobShape_default_instance_.Shutdown();
  delete file_level_metadata[0].reflection;
  _BlobProto_default_instance_.Shutdown();
  delete file_level_metadata[1].reflection;
  _BlobProtoVector_default_instance_.Shutdown();
  delete file_level_metadata[2].reflection;
  _Datum_default_instance_.Shutdown();
  delete file_level_metadata[3].reflection;
  _FillerParameter_default_instance_.Shutdown();
  delete file_level_metadata[4].reflection;
  FillerParameter::_default_type_.Shutdown();
  _NetParameter_default_instance_.Shutdown();
  delete file_level_metadata[5].reflection;
  _SolverParameter_default_instance_.Shutdown();
  delete file_level_metadata[6].reflection;
  SolverParameter::_default_regularization_type_.Shutdown();
  SolverParameter::_default_type_.Shutdown();
  _SolverState_default_instance_.Shutdown();
  delete file_level_metadata[7].reflection;
  _NetState_default_instance_.Shutdown();
  delete file_level_metadata[8].reflection;
  _NetStateRule_default_instance_.Shutdown();
  delete file_level_metadata[9].reflection;
  _ParamSpec_default_instance_.Shutdown();
  delete file_level_metadata[10].reflection;
  _LayerParameter_default_instance_.Shutdown();
  delete file_level_metadata[11].reflection;
  _TransformationParameter_default_instance_.Shutdown();
  delete file_level_metadata[12].reflection;
  _LossParameter_default_instance_.Shutdown();
  delete file_level_metadata[13].reflection;
  _AccuracyParameter_default_instance_.Shutdown();
  delete file_level_metadata[14].reflection;
  _ArgMaxParameter_default_instance_.Shutdown();
  delete file_level_metadata[15].reflection;
  _ConcatParameter_default_instance_.Shutdown();
  delete file_level_metadata[16].reflection;
  _BatchNormParameter_default_instance_.Shutdown();
  delete file_level_metadata[17].reflection;
  _BiasParameter_default_instance_.Shutdown();
  delete file_level_metadata[18].reflection;
  _ContrastiveLossParameter_default_instance_.Shutdown();
  delete file_level_metadata[19].reflection;
  _ConvolutionParameter_default_instance_.Shutdown();
  delete file_level_metadata[20].reflection;
  _CropParameter_default_instance_.Shutdown();
  delete file_level_metadata[21].reflection;
  _DataParameter_default_instance_.Shutdown();
  delete file_level_metadata[22].reflection;
  _DropoutParameter_default_instance_.Shutdown();
  delete file_level_metadata[23].reflection;
  _DummyDataParameter_default_instance_.Shutdown();
  delete file_level_metadata[24].reflection;
  _EltwiseParameter_default_instance_.Shutdown();
  delete file_level_metadata[25].reflection;
  _ELUParameter_default_instance_.Shutdown();
  delete file_level_metadata[26].reflection;
  _EmbedParameter_default_instance_.Shutdown();
  delete file_level_metadata[27].reflection;
  _ExpParameter_default_instance_.Shutdown();
  delete file_level_metadata[28].reflection;
  _FlattenParameter_default_instance_.Shutdown();
  delete file_level_metadata[29].reflection;
  _HDF5DataParameter_default_instance_.Shutdown();
  delete file_level_metadata[30].reflection;
  _HDF5OutputParameter_default_instance_.Shutdown();
  delete file_level_metadata[31].reflection;
  _HingeLossParameter_default_instance_.Shutdown();
  delete file_level_metadata[32].reflection;
  _ImageDataParameter_default_instance_.Shutdown();
  delete file_level_metadata[33].reflection;
  _InfogainLossParameter_default_instance_.Shutdown();
  delete file_level_metadata[34].reflection;
  _InnerProductParameter_default_instance_.Shutdown();
  delete file_level_metadata[35].reflection;
  _InputParameter_default_instance_.Shutdown();
  delete file_level_metadata[36].reflection;
  _LogParameter_default_instance_.Shutdown();
  delete file_level_metadata[37].reflection;
  _LRNParameter_default_instance_.Shutdown();
  delete file_level_metadata[38].reflection;
  _MemoryDataParameter_default_instance_.Shutdown();
  delete file_level_metadata[39].reflection;
  _MVNParameter_default_instance_.Shutdown();
  delete file_level_metadata[40].reflection;
  _ParameterParameter_default_instance_.Shutdown();
  delete file_level_metadata[41].reflection;
  _PoolingParameter_default_instance_.Shutdown();
  delete file_level_metadata[42].reflection;
  _PowerParameter_default_instance_.Shutdown();
  delete file_level_metadata[43].reflection;
  _PythonParameter_default_instance_.Shutdown();
  delete file_level_metadata[44].reflection;
  _RecurrentParameter_default_instance_.Shutdown();
  delete file_level_metadata[45].reflection;
  _ReductionParameter_default_instance_.Shutdown();
  delete file_level_metadata[46].reflection;
  _ReLUParameter_default_instance_.Shutdown();
  delete file_level_metadata[47].reflection;
  _ReshapeParameter_default_instance_.Shutdown();
  delete file_level_metadata[48].reflection;
  _ScaleParameter_default_instance_.Shutdown();
  delete file_level_metadata[49].reflection;
  _SigmoidParameter_default_instance_.Shutdown();
  delete file_level_metadata[50].reflection;
  _SliceParameter_default_instance_.Shutdown();
  delete file_level_metadata[51].reflection;
  _SoftmaxParameter_default_instance_.Shutdown();
  delete file_level_metadata[52].reflection;
  _TanHParameter_default_instance_.Shutdown();
  delete file_level_metadata[53].reflection;
  _TileParameter_default_instance_.Shutdown();
  delete file_level_metadata[54].reflection;
  _ThresholdParameter_default_instance_.Shutdown();
  delete file_level_metadata[55].reflection;
  _WindowDataParameter_default_instance_.Shutdown();
  delete file_level_metadata[56].reflection;
  WindowDataParameter::_default_crop_mode_.Shutdown();
  _SPPParameter_default_instance_.Shutdown();
  delete file_level_metadata[57].reflection;
  _V1LayerParameter_default_instance_.Shutdown();
  delete file_level_metadata[58].reflection;
  _V0LayerParameter_default_instance_.Shutdown();
  delete file_level_metadata[59].reflection;
  V0LayerParameter::_default_det_crop_mode_.Shutdown();
  _PReLUParameter_default_instance_.Shutdown();
  delete file_level_metadata[60].reflection;
}